

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int run_container_intersection_cardinality(run_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  rle16_t *prVar4;
  rle16_t *prVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int32_t n_runs;
  rle16_t *runs;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  ulong uVar9;
  
  uVar7 = src_1->n_runs;
  uVar9 = (ulong)uVar7;
  prVar4 = src_1->runs;
  uVar1 = prVar4->value;
  if (uVar1 == 0 && uVar9 == 1) {
    bVar21 = prVar4->length == 0xffff;
  }
  else {
    bVar21 = false;
  }
  uVar3 = src_2->n_runs;
  uVar10 = (ulong)uVar3;
  prVar5 = src_2->runs;
  uVar2 = prVar5->value;
  if (uVar2 == 0 && uVar10 == 1) {
    bVar22 = prVar5->length == 0xffff;
  }
  else {
    bVar22 = false;
  }
  if (!bVar21 && !bVar22) {
LAB_00110fa4:
    iVar8 = 0;
    if (0 < (int)uVar3 && 0 < (int)uVar7) {
      uVar11 = (uint)uVar1;
      uVar13 = (uint)uVar2;
      uVar14 = (uint)uVar2 + (uint)prVar5->length + 1;
      uVar16 = (uint)uVar1 + (uint)prVar4->length + 1;
      iVar18 = 0;
      iVar19 = 0;
      iVar8 = 0;
      do {
        if (uVar13 < uVar16) {
          if (uVar11 < uVar14) {
            uVar20 = uVar13;
            if (uVar13 < uVar11) {
              uVar20 = uVar11;
            }
            uVar15 = uVar14;
            if (uVar16 == uVar14) {
              iVar19 = iVar19 + 1;
              uVar16 = uVar14;
              if (iVar19 < (int)uVar7) {
                uVar11 = (uint)prVar4[iVar19].value;
                uVar16 = prVar4[iVar19].length + uVar11 + 1;
              }
              iVar17 = iVar18 + 1;
              if (iVar17 < (int)uVar3) {
                uVar13 = (uint)prVar5[iVar17].value;
                iVar18 = iVar17;
                uVar14 = prVar5[iVar17].length + uVar13 + 1;
              }
              else {
LAB_001110bd:
                iVar18 = iVar18 + 1;
              }
            }
            else if (uVar16 < uVar14) {
              iVar19 = iVar19 + 1;
              uVar15 = uVar16;
              if (iVar19 < (int)uVar7) {
                uVar11 = (uint)prVar4[iVar19].value;
                uVar16 = prVar4[iVar19].length + uVar11 + 1;
              }
            }
            else {
              iVar17 = iVar18 + 1;
              if ((int)uVar3 <= iVar17) goto LAB_001110bd;
              uVar13 = (uint)prVar5[iVar17].value;
              iVar18 = iVar17;
              uVar14 = uVar13 + prVar5[iVar17].length + 1;
            }
            iVar8 = (iVar8 - uVar20) + uVar15;
          }
          else {
            iVar18 = iVar18 + 1;
            if (iVar18 < (int)uVar3) {
              uVar13 = (uint)prVar5[iVar18].value;
              uVar14 = prVar5[iVar18].length + uVar13 + 1;
            }
          }
        }
        else {
          iVar19 = iVar19 + 1;
          if (iVar19 < (int)uVar7) {
            uVar11 = (uint)prVar4[iVar19].value;
            uVar16 = uVar11 + prVar4[iVar19].length + 1;
          }
        }
      } while ((iVar19 < (int)uVar7) && (iVar18 < (int)uVar3));
    }
    return iVar8;
  }
  if (bVar21) {
    lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
      if ((int)uVar3 < 1) {
        return uVar3;
      }
      uVar12 = 0;
      uVar9 = uVar10;
      do {
        uVar7 = (int)uVar9 + (uint)prVar5[uVar12].length;
        uVar9 = (ulong)uVar7;
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
      return uVar7;
    }
  }
  else {
    if (!bVar22) goto LAB_00110fa4;
    lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
    src_2 = src_1;
    if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
      if ((int)uVar7 < 1) {
        return uVar7;
      }
      uVar12 = 0;
      uVar10 = uVar9;
      do {
        uVar7 = (int)uVar10 + (uint)prVar4[uVar12].length;
        uVar10 = (ulong)uVar7;
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
      return uVar7;
    }
  }
  iVar8 = _avx2_run_container_cardinality(src_2);
  return iVar8;
}

Assistant:

int run_container_intersection_cardinality(const run_container_t *src_1,
                                           const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return run_container_cardinality(src_2);
        }
        if (if2) {
            return run_container_cardinality(src_1);
        }
    }
    int answer = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            answer += earliestend - lateststart;
        }
    }
    return answer;
}